

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall rsg::Function::~Function(Function *this)

{
  Variable *this_00;
  pointer ppVVar1;
  pointer ppVVar2;
  
  for (ppVVar2 = (this->m_parameters).
                 super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar2 !=
      (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
    this_00 = *ppVVar2;
    if (this_00 != (Variable *)0x0) {
      rsg::Variable::~Variable(this_00);
    }
    operator_delete(this_00,0x80);
  }
  ppVVar1 = (this->m_parameters).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != ppVVar1) {
    (this->m_parameters).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVVar1;
  }
  BlockStatement::~BlockStatement(&this->m_functionBlock);
  VariableType::~VariableType(&this->m_returnType);
  std::_Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~_Vector_base
            (&(this->m_parameters).
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Function::~Function (void)
{
	deleteVectorElements(m_parameters);
}